

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O1

void __thiscall
Js::FunctionBodyPolymorphicInlineCache::PrintStats
          (FunctionBodyPolymorphicInlineCache *this,InlineCacheData *data)

{
  ScriptContext *pSVar1;
  PropertyRecord *pPVar2;
  char16 *pcVar3;
  char16 *pcVar4;
  char16_t *pcVar5;
  uint uVar6;
  float fVar7;
  WCHAR local_898 [4];
  wchar funcName [1024];
  char16 debugStringBuffer [42];
  
  uVar6 = data->misses + data->hits;
  pSVar1 = FunctionProxy::GetScriptContext((FunctionProxy *)this->functionBody);
  pPVar2 = ThreadContext::GetPropertyName(pSVar1->threadContext,data->propertyId);
  pcVar3 = ParseableFunctionInfo::GetExternalDisplayName
                     (&this->functionBody->super_ParseableFunctionInfo);
  pcVar4 = FunctionProxy::GetDebugNumberSet
                     ((FunctionProxy *)this->functionBody,(wchar (*) [42])(funcName + 0x3fc));
  swprintf_s<1024ul>((WCHAR (*) [1024])local_898,L"%s (%s)",pcVar3,pcVar4);
  pcVar5 = L"set";
  if (data->isGetCache != false) {
    pcVar5 = L"get";
  }
  fVar7 = (float)uVar6;
  Output::Print(L"%s,%s,%s,%d,%d,%f,%d,%f,%d\n",(double)((float)data->misses / fVar7),
                (double)((float)data->collisions / fVar7),(WCHAR (*) [1024])local_898,pPVar2 + 1,
                pcVar5,(ulong)uVar6,(ulong)data->misses,(ulong)data->collisions,
                (ulong)(this->super_PolymorphicInlineCache).size);
  return;
}

Assistant:

void FunctionBodyPolymorphicInlineCache::PrintStats(InlineCacheData *data) const
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        wchar funcName[1024];
        uint total = data->hits + data->misses;
        char16 const *propName = this->functionBody->GetScriptContext()->GetThreadContext()->GetPropertyName(data->propertyId)->GetBuffer();
        swprintf_s(funcName, _u("%s (%s)"), this->functionBody->GetExternalDisplayName(), this->functionBody->GetDebugNumberSet(debugStringBuffer));

        Output::Print(_u("%s,%s,%s,%d,%d,%f,%d,%f,%d\n"),
            funcName,
            propName,
            data->isGetCache ? _u("get") : _u("set"),
            total,
            data->misses,
            static_cast<float>(data->misses) / total,
            data->collisions,
            static_cast<float>(data->collisions) / total,
            GetSize()
        );
    }